

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O2

aiReturn __thiscall Assimp::Importer::RegisterLoader(Importer *this,BaseImporter *pImp)

{
  bool bVar1;
  Logger *pLVar2;
  _Base_ptr p_Var3;
  string baked;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  st;
  char *local_220 [4];
  BaseImporter *local_200;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  
  local_200 = pImp;
  if (pImp != (BaseImporter *)0x0) {
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1d8._M_impl.super__Rb_tree_header._M_header;
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1f8 = local_1e8;
    local_1f0 = 0;
    local_1e8[0] = 0;
    local_1d8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
    BaseImporter::GetExtensionList
              (pImp,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1d8);
    for (p_Var3 = local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &local_1d8._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      bVar1 = IsExtensionSupported(this,(string *)(p_Var3 + 1));
      if (bVar1) {
        pLVar2 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[20]>(&local_1a8,(char (*) [20])"The file extension ");
        std::operator<<((ostream *)&local_1a8,(string *)(p_Var3 + 1));
        std::operator<<((ostream *)&local_1a8," is already in use");
        std::__cxx11::stringbuf::str();
        Logger::warn(pLVar2,local_220[0]);
        std::__cxx11::string::~string((string *)local_220);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      }
      std::__cxx11::string::append((string *)&local_1f8);
    }
    std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::push_back
              (&this->pimpl->mImporter,&local_200);
    pLVar2 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[56]>
              (&local_1a8,(char (*) [56])"Registering custom importer for these file extensions: ");
    std::operator<<((ostream *)&local_1a8,(string *)&local_1f8);
    std::__cxx11::stringbuf::str();
    Logger::info(pLVar2,local_220[0]);
    std::__cxx11::string::~string((string *)local_220);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_1d8);
    return aiReturn_SUCCESS;
  }
  __assert_fail("__null != pImp",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/Importer.cpp"
                ,0xda,"aiReturn Assimp::Importer::RegisterLoader(BaseImporter *)");
}

Assistant:

aiReturn Importer::RegisterLoader(BaseImporter* pImp)
{
    ai_assert(NULL != pImp);
    ASSIMP_BEGIN_EXCEPTION_REGION();

    // --------------------------------------------------------------------
    // Check whether we would have two loaders for the same file extension
    // This is absolutely OK, but we should warn the developer of the new
    // loader that his code will probably never be called if the first
    // loader is a bit too lazy in his file checking.
    // --------------------------------------------------------------------
    std::set<std::string> st;
    std::string baked;
    pImp->GetExtensionList(st);

    for(std::set<std::string>::const_iterator it = st.begin(); it != st.end(); ++it) {

#ifdef ASSIMP_BUILD_DEBUG
        if (IsExtensionSupported(*it)) {
            ASSIMP_LOG_WARN_F("The file extension ", *it, " is already in use");
        }
#endif
        baked += *it;
    }

    // add the loader
    pimpl->mImporter.push_back(pImp);
    ASSIMP_LOG_INFO_F("Registering custom importer for these file extensions: ", baked);
    ASSIMP_END_EXCEPTION_REGION(aiReturn);
    return AI_SUCCESS;
}